

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BitsEqual32Bit_Test::testBody(TEST_TestFailure_BitsEqual32Bit_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_a8 [56];
  BitsEqualFailure f;
  TEST_TestFailure_BitsEqual32Bit_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"");
  BitsEqualFailure::BitsEqualFailure
            ((BitsEqualFailure *)(local_a8 + 0x30),pUVar1,fileName,2,1,3,0xffffffff,4,
             (SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <00000000 00000000 00000000 00000001>\n\tbut was  <00000000 00000000 00000000 00000011>"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x1a5,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  BitsEqualFailure::~BitsEqualFailure((BitsEqualFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, BitsEqual32Bit)
{
    BitsEqualFailure f(test, failFileName, failLineNumber, 0x00000001, 0x00000003, 0xFFFFFFFF, 4*8/CPPUTEST_CHAR_BIT, "");
    FAILURE_EQUAL("expected <00000000 00000000 00000000 00000001>\n\tbut was  <00000000 00000000 00000000 00000011>", f);
}